

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Value * __thiscall cashew::Value::setString(Value *this,char *s)

{
  size_t sVar1;
  anon_union_16_6_a0c44491_for_Value_2 aVar2;
  
  free(this,s);
  this->type = String;
  sVar1 = strlen(s);
  aVar2 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(sVar1,s,0);
  this->field_1 = aVar2;
  return this;
}

Assistant:

Value& setString(const char* s) {
    free();
    type = String;
    str = IString(s);
    return *this;
  }